

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall RawRCONConsoleCommand::trigger(RawRCONConsoleCommand *this,string_view parameters)

{
  Server *pSVar1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *this_00;
  bool bVar2;
  ostream *poVar3;
  reference ppSVar4;
  __sv_type _Var5;
  size_t local_a8;
  char *local_a0;
  Server **server;
  const_iterator __end1;
  const_iterator __begin1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range1;
  undefined1 local_70 [8];
  string msg;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> local_40 [24];
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_28;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  RawRCONConsoleCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (RawRCONConsoleCommand *)parameters._M_len;
  servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)this;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Error: Too Few Parameters. Syntax: rrcon <input>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    RenX::getCore();
    RenX::Core::getServers();
    local_28 = local_40;
    bVar2 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::empty(local_28);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Error: Not connected to any Renegade X servers.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      msg.field_2._8_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_70,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 (allocator<char> *)((long)&__range1 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,'\n')
      ;
      this_00 = local_28;
      __end1 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_28);
      server = (Server **)std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(this_00)
      ;
      while( true ) {
        bVar2 = __gnu_cxx::
                operator==<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                          (&__end1,(__normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                    *)&server);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        ppSVar4 = __gnu_cxx::
                  __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                  ::operator*(&__end1);
        pSVar1 = *ppSVar4;
        _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
        local_a8 = _Var5._M_len;
        local_a0 = _Var5._M_str;
        RenX::Server::sendData(pSVar1,local_a8,local_a0);
        __gnu_cxx::
        __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
        ::operator++(&__end1);
      }
      std::__cxx11::string::~string((string *)local_70);
      msg.field_2._8_4_ = 0;
    }
    std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector(local_40);
  }
  return;
}

Assistant:

void RawRCONConsoleCommand::trigger(std::string_view parameters) {
	if (parameters.empty()) {
		std::cout << "Error: Too Few Parameters. Syntax: rrcon <input>" << std::endl;
		return;
	}

	const auto& servers = RenX::getCore()->getServers();
	if (servers.empty()) {
		std::cout << "Error: Not connected to any Renegade X servers." << std::endl;
		return;
	}

	std::string msg{ parameters };
	msg += '\n';
	for (const auto& server : servers) {
		server->sendData(msg);
	}
}